

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opbehavior.cc
# Opt level: O2

uintb __thiscall
OpBehaviorIntSright::evaluateBinary
          (OpBehaviorIntSright *this,int4 sizeout,int4 sizein,uintb in1,uintb in2)

{
  bool bVar1;
  int iVar2;
  uintb uVar3;
  
  bVar1 = signbit_negative(in1,sizein);
  uVar3 = in1 >> ((byte)in2 & 0x3f);
  if (bVar1) {
    iVar2 = 8;
    if (sizein < 8) {
      iVar2 = sizein;
    }
    uVar3 = uVar3 | uintbmasks[iVar2] >> ((byte)in2 & 0x3f) ^ uintbmasks[iVar2];
  }
  return uVar3;
}

Assistant:

uintb OpBehaviorIntSright::evaluateBinary(int4 sizeout,int4 sizein,uintb in1,uintb in2) const

{
  uintb res;
  if (signbit_negative(in1,sizein)) {
    res = in1 >> in2;
    uintb mask = calc_mask(sizein);
    mask = (mask >> in2) ^ mask;
    res |= mask;
  }
  else {
    res = in1 >> in2;
  }
  return res;
}